

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventObservationModelMapping.h
# Opt level: O2

Matrix * __thiscall
EventObservationModelMapping::GetMatrixPtr(EventObservationModelMapping *this,Index a,Index jo_i)

{
  const_reference this_00;
  const_reference ppmVar1;
  
  this_00 = std::
            vector<std::vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
            ::at(&this->_m_O,(ulong)a);
  ppmVar1 = std::
            vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            ::at(this_00,(ulong)jo_i);
  return *ppmVar1;
}

Assistant:

const Matrix* GetMatrixPtr(Index a, Index jo_i) const
        { return(_m_O.at(a).at(jo_i)); }